

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::HeapType::HeapType(HeapType *this,Signature sig)

{
  HeapType HVar1;
  Signature local_28;
  HeapType *this_local;
  Signature sig_local;
  
  sig_local.params = sig.results.id;
  this_local = (HeapType *)sig.params.id;
  local_28.results.id = (uintptr_t)this;
  std::make_unique<wasm::(anonymous_namespace)::HeapTypeInfo,wasm::Signature&>(&local_28);
  HVar1 = anon_unknown_0::RecGroupStore::insert
                    ((RecGroupStore *)wasm::(anonymous_namespace)::globalRecGroupStore,
                     (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                      *)&local_28);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&local_28);
  return;
}

Assistant:

HeapType::HeapType(Signature sig) {
  new (this)
    HeapType(globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(sig)));
}